

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_conversion.cpp
# Opt level: O2

crn_bool crnlib::texture_conversion::crn_progress_callback
                   (crn_uint32 phase_index,crn_uint32 total_phases,crn_uint32 subphase_index,
                   crn_uint32 total_subphases,void *pUser_data_ptr)

{
  code *pcVar1;
  char cVar2;
  int iVar3;
  crn_bool cVar4;
  int iVar5;
  
  cVar4 = 0;
  if (*(char *)((long)pUser_data_ptr + 0xc) == '\0') {
    pcVar1 = *(code **)(*pUser_data_ptr + 0x3f0);
    cVar4 = 1;
    if (pcVar1 != (code *)0x0) {
      iVar3 = (int)(((100.0 - (float)*(uint *)((long)pUser_data_ptr + 8)) *
                    ((float)subphase_index / (float)total_subphases + (float)phase_index)) /
                    (float)total_phases + 0.5) + *(uint *)((long)pUser_data_ptr + 8);
      iVar5 = 100;
      if (iVar3 < 100) {
        iVar5 = iVar3;
      }
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      cVar2 = (*pcVar1)(iVar5,*(undefined8 *)(*pUser_data_ptr + 0x3f8));
      if (cVar2 == '\0') {
        *(undefined1 *)((long)pUser_data_ptr + 0xc) = 1;
        cVar4 = 0;
      }
    }
  }
  return cVar4;
}

Assistant:

static crn_bool crn_progress_callback(crn_uint32 phase_index, crn_uint32 total_phases, crn_uint32 subphase_index, crn_uint32 total_subphases, void* pUser_data_ptr) {
  progress_params& params = *static_cast<progress_params*>(pUser_data_ptr);

  if (params.m_canceled)
    return false;
  if (!params.m_pParams->m_pProgress_func)
    return true;

  int percentage_complete = params.m_start_percentage + (int)(.5f + (phase_index + float(subphase_index) / total_subphases) * (100.0f - params.m_start_percentage) / total_phases);

  percentage_complete = math::clamp<int>(percentage_complete, 0, 100);

  if (!params.m_pParams->m_pProgress_func(percentage_complete, params.m_pParams->m_pProgress_user_data)) {
    params.m_canceled = true;
    return false;
  }

  return true;
}